

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O2

bool __thiscall
HighsDomain::ConflictSet::resolveLinearLeq
          (ConflictSet *this,HighsCDouble M,double Mlower,double *vals)

{
  double *pdVar1;
  pointer pHVar2;
  int iVar3;
  pointer pLVar4;
  pointer pRVar5;
  pointer pLVar6;
  pointer pRVar7;
  HighsDomain *pHVar8;
  HighsMipSolver *pHVar9;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var10;
  pointer pHVar11;
  pointer ppVar12;
  pointer pLVar13;
  double dVar14;
  HighsBoundType HVar15;
  undefined4 uVar16;
  bool bVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  size_type __new_size;
  double dVar22;
  double dVar23;
  double dVar24;
  HighsCDouble HVar25;
  HighsCDouble M_local;
  LocalDomChg locdomchg;
  ulong local_58;
  HighsCDouble local_50;
  HighsCDouble local_40;
  
  M_local.lo = M.lo;
  M_local.hi = M.hi;
  pLVar4 = (this->resolvedDomainChanges).
           super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolvedDomainChanges).
      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar4) {
    (this->resolvedDomainChanges).
    super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar4;
  }
  HVar25 = HighsCDouble::operator-(&M_local,Mlower);
  dVar22 = HVar25.lo + HVar25.hi;
  bVar17 = true;
  if (dVar22 < 0.0) {
    lVar21 = -1;
    lVar19 = 0;
    do {
      pRVar5 = (this->resolveBuffer).
               super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar21 = lVar21 + 1;
      if ((int)((ulong)((long)(this->resolveBuffer).
                              super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5) >> 5) <=
          lVar21) break;
      iVar3 = *(int *)((long)&pRVar5->boundPos + lVar19);
      locdomchg.pos = iVar3;
      pHVar2 = (this->localdom->domchgstack_).
               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
               super__Vector_impl_data._M_start + iVar3;
      locdomchg.domchg.boundval = pHVar2->boundval;
      locdomchg.domchg.column = pHVar2->column;
      locdomchg.domchg.boundtype = pHVar2->boundtype;
      dVar22 = *(double *)((long)&pRVar5->delta + lVar19);
      dVar24 = dVar22 + M_local.hi;
      M_local.lo = (M_local.hi - (dVar24 - dVar22)) + (dVar22 - (dVar24 - (dVar24 - dVar22))) +
                   M_local.lo;
      M_local.hi = dVar24;
      std::
      vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ::push_back(&this->resolvedDomainChanges,&locdomchg);
      HVar25 = HighsCDouble::operator-(&M_local,Mlower);
      dVar22 = HVar25.lo + HVar25.hi;
      lVar19 = lVar19 + 0x20;
    } while (dVar22 < 0.0);
    if (0.0 <= dVar22) {
      pdVar1 = &((this->localdom->mipsolver->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol;
      if (*pdVar1 <= dVar22 && dVar22 != *pdVar1) {
        local_58 = ((long)(this->resolvedDomainChanges).
                          super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->resolvedDomainChanges).
                         super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff;
LAB_002a6a12:
        do {
          local_58 = local_58 - 1;
          if ((int)(uint)local_58 < 0) break;
          uVar18 = (uint)local_58 & 0x7fffffff;
          pLVar6 = (this->resolvedDomainChanges).
                   super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pRVar7 = (this->resolveBuffer).
                   super__Vector_base<HighsDomain::ConflictSet::ResolveCandidate,_std::allocator<HighsDomain::ConflictSet::ResolveCandidate>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pRVar5 = pRVar7 + uVar18;
          pLVar4 = pLVar6 + uVar18;
          iVar3 = pRVar7[uVar18].valuePos;
          iVar20 = pLVar6[uVar18].domchg.column;
          dVar22 = pLVar6[uVar18].domchg.boundval;
          dVar24 = pRVar7[uVar18].baseBound;
          if (pLVar6[uVar18].domchg.boundtype == kLower) {
            HVar25 = HighsCDouble::operator-(&M_local,pRVar5->delta);
            local_50.lo = HVar25.lo;
            local_50.hi = HVar25.hi;
            HVar25 = operator-(Mlower,&local_50);
            local_40.lo = HVar25.lo;
            local_40.hi = HVar25.hi;
            HVar25 = HighsCDouble::operator/(&local_40,vals[iVar3]);
            locdomchg.domchg.boundval = HVar25.lo;
            locdomchg._0_8_ = HVar25.hi;
            HVar25 = HighsCDouble::operator+((HighsCDouble *)&locdomchg,dVar24);
            dVar23 = HVar25.lo + HVar25.hi;
            pHVar8 = this->localdom;
            pHVar9 = pHVar8->mipsolver;
            _Var10._M_head_impl =
                 (pHVar9->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            pHVar11 = (pHVar9->model_->integrality_).
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar14 = ceil(dVar23);
            if (pHVar11[iVar20] != kContinuous) {
              dVar23 = dVar14;
            }
            dVar22 = dVar23 - dVar22;
            if (-(_Var10._M_head_impl)->feastol <= dVar22) goto LAB_002a6a12;
            (pLVar4->domchg).boundval = dVar23;
            if (dVar23 - dVar24 <= (_Var10._M_head_impl)->epsilon) goto LAB_002a6cf2;
            ppVar12 = (pHVar8->prevboundval_).
                      super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            iVar20 = pLVar4->pos;
            while (dVar23 <= ppVar12[iVar20].first) {
              iVar20 = ppVar12[iVar20].second;
              pLVar4->pos = iVar20;
            }
            dVar22 = dVar22 * vals[iVar3];
            dVar24 = M_local.hi + dVar22;
            M_local.lo = (M_local.hi - (dVar24 - dVar22)) + (dVar22 - (dVar24 - (dVar24 - dVar22)))
                         + M_local.lo;
            M_local.hi = dVar24;
          }
          else {
            HVar25 = HighsCDouble::operator-(&M_local,pRVar5->delta);
            local_50.lo = HVar25.lo;
            local_50.hi = HVar25.hi;
            HVar25 = operator-(Mlower,&local_50);
            local_40.lo = HVar25.lo;
            local_40.hi = HVar25.hi;
            HVar25 = HighsCDouble::operator/(&local_40,vals[iVar3]);
            locdomchg.domchg.boundval = HVar25.lo;
            locdomchg._0_8_ = HVar25.hi;
            HVar25 = HighsCDouble::operator+((HighsCDouble *)&locdomchg,dVar24);
            dVar23 = HVar25.lo + HVar25.hi;
            pHVar8 = this->localdom;
            pHVar9 = pHVar8->mipsolver;
            _Var10._M_head_impl =
                 (pHVar9->mipdata_)._M_t.
                 super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                 .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
            pHVar11 = (pHVar9->model_->integrality_).
                      super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
                      super__Vector_impl_data._M_start;
            dVar14 = floor(dVar23);
            if (pHVar11[iVar20] != kContinuous) {
              dVar23 = dVar14;
            }
            dVar22 = dVar23 - dVar22;
            if (dVar22 <= (_Var10._M_head_impl)->feastol) goto LAB_002a6a12;
            (pLVar4->domchg).boundval = dVar23;
            if (-(_Var10._M_head_impl)->epsilon <= dVar23 - dVar24) {
LAB_002a6cf2:
              pLVar13 = (this->resolvedDomainChanges).
                        super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              __new_size = (((long)(this->resolvedDomainChanges).
                                   super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar13) /
                            0x18 << 0x20) + -0x100000000 >> 0x20;
              locdomchg.domchg.column = pLVar13[__new_size].domchg.column;
              locdomchg.domchg.boundtype = pLVar13[__new_size].domchg.boundtype;
              pLVar4 = pLVar13 + __new_size;
              locdomchg.pos = pLVar4->pos;
              locdomchg._4_4_ = *(undefined4 *)&pLVar4->field_0x4;
              locdomchg.domchg.boundval = (pLVar4->domchg).boundval;
              HVar15 = pLVar13[uVar18].domchg.boundtype;
              pLVar13[__new_size].domchg.column = pLVar13[uVar18].domchg.column;
              pLVar13[__new_size].domchg.boundtype = HVar15;
              pLVar4 = pLVar13 + uVar18;
              uVar16 = *(undefined4 *)&pLVar4->field_0x4;
              dVar22 = (pLVar4->domchg).boundval;
              pLVar6 = pLVar13 + __new_size;
              pLVar6->pos = pLVar4->pos;
              *(undefined4 *)&pLVar6->field_0x4 = uVar16;
              (pLVar6->domchg).boundval = dVar22;
              pLVar13[uVar18].domchg.column = locdomchg.domchg.column;
              pLVar13[uVar18].domchg.boundtype = locdomchg.domchg.boundtype;
              pLVar13 = pLVar13 + uVar18;
              pLVar13->pos = locdomchg.pos;
              *(undefined4 *)&pLVar13->field_0x4 = locdomchg._4_4_;
              (pLVar13->domchg).boundval = locdomchg.domchg.boundval;
              std::
              vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
              ::resize(&this->resolvedDomainChanges,__new_size);
              HighsCDouble::operator-=(&M_local,pRVar5->delta);
            }
            else {
              ppVar12 = (pHVar8->prevboundval_).
                        super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              iVar20 = pLVar4->pos;
              while (ppVar12[iVar20].first <= dVar23) {
                iVar20 = ppVar12[iVar20].second;
                pLVar4->pos = iVar20;
              }
              dVar22 = dVar22 * vals[iVar3];
              dVar24 = M_local.hi + dVar22;
              M_local.lo = (M_local.hi - (dVar24 - dVar22)) +
                           (dVar22 - (dVar24 - (dVar24 - dVar22))) + M_local.lo;
              M_local.hi = dVar24;
            }
          }
          HVar25 = HighsCDouble::operator-(&M_local,Mlower);
        } while (((this->localdom->mipsolver->mipdata_)._M_t.
                  super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                  .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol <
                 HVar25.lo + HVar25.hi);
      }
      bVar17 = true;
    }
    else {
      bVar17 = false;
    }
  }
  return bVar17;
}

Assistant:

bool HighsDomain::ConflictSet::resolveLinearLeq(HighsCDouble M, double Mlower,
                                                const double* vals) {
  resolvedDomainChanges.clear();
  double covered = double(M - Mlower);
  if (covered < 0) {
    for (HighsInt k = 0; k < (HighsInt)resolveBuffer.size(); ++k) {
      ResolveCandidate& reasonDomchg = resolveBuffer[k];
      LocalDomChg locdomchg;
      locdomchg.pos = reasonDomchg.boundPos;
      locdomchg.domchg = localdom.domchgstack_[reasonDomchg.boundPos];
      M += reasonDomchg.delta;
      resolvedDomainChanges.push_back(locdomchg);
      assert(resolvedDomainChanges.back().pos >= 0);
      assert(resolvedDomainChanges.back().pos <
             (HighsInt)localdom.domchgstack_.size());
      covered = double(M - Mlower);
      if (covered >= 0) break;
    }

    if (covered < 0) {
      // printf("local bounds reach only value of %.12g, need at least
      // %.12g\n",
      //        M, Mlower);
      return false;
    }

    if (covered > localdom.feastol()) {
      // there is room for relaxing bounds / dropping unneeded bound changes
      // from the explanation
      // HighsInt numRelaxed = 0;
      // HighsInt numDropped = 0;
      for (HighsInt k = resolvedDomainChanges.size() - 1; k >= 0; --k) {
        ResolveCandidate& reasonDomchg = resolveBuffer[k];
        LocalDomChg& locdomchg = resolvedDomainChanges[k];
        HighsInt i = reasonDomchg.valuePos;
        HighsInt col = locdomchg.domchg.column;
        if (locdomchg.domchg.boundtype == HighsBoundType::kLower) {
          double lb = locdomchg.domchg.boundval;
          double glb = reasonDomchg.baseBound;
          double relaxLb =
              double(((Mlower - (M - reasonDomchg.delta)) / vals[i]) + glb);
          if (localdom.mipsolver->variableType(col) !=
              HighsVarType::kContinuous)
            relaxLb = std::ceil(relaxLb);

          if (relaxLb - lb >= -localdom.feastol()) continue;

          locdomchg.domchg.boundval = relaxLb;

          if (relaxLb - glb <= localdom.mipsolver->mipdata_->epsilon) {
            // domain change can be fully removed from conflict
            HighsInt last = resolvedDomainChanges.size() - 1;
            std::swap(resolvedDomainChanges[last], resolvedDomainChanges[k]);
            resolvedDomainChanges.resize(last);

            M -= reasonDomchg.delta;
            // ++numDropped;
          } else {
            // bound can be relaxed
            while (relaxLb <= localdom.prevboundval_[locdomchg.pos].first)
              locdomchg.pos = localdom.prevboundval_[locdomchg.pos].second;

            M += vals[i] * (relaxLb - lb);
            // ++numRelaxed;
          }

          covered = double(M - Mlower);
          if (covered <= localdom.feastol()) break;
        } else {
          double ub = locdomchg.domchg.boundval;
          double gub = reasonDomchg.baseBound;
          double relaxUb =
              double(((Mlower - (M - reasonDomchg.delta)) / vals[i]) + gub);
          if (localdom.mipsolver->variableType(col) !=
              HighsVarType::kContinuous)
            relaxUb = std::floor(relaxUb);

          if (relaxUb - ub <= localdom.feastol()) continue;

          locdomchg.domchg.boundval = relaxUb;

          if (relaxUb - gub >= -localdom.mipsolver->mipdata_->epsilon) {
            // domain change can be fully removed from conflict
            HighsInt last = resolvedDomainChanges.size() - 1;
            std::swap(resolvedDomainChanges[last], resolvedDomainChanges[k]);
            resolvedDomainChanges.resize(last);

            M -= reasonDomchg.delta;
            // ++numDropped;
          } else {
            // bound can be relaxed
            while (relaxUb >= localdom.prevboundval_[locdomchg.pos].first)
              locdomchg.pos = localdom.prevboundval_[locdomchg.pos].second;

            M += vals[i] * (relaxUb - ub);
            // ++numRelaxed;
          }

          covered = double(M - Mlower);
          if (covered <= localdom.feastol()) break;
        }
      }

      // if (numRelaxed + numDropped)
      //   printf("relaxed %d and dropped %d of %d resolved domain changes\n",
      //          (int)numRelaxed, (int)numDropped,
      //          (int)resolvedDomainChanges.size());

      assert(covered >= -localdom.mipsolver->mipdata_->feastol);
    }
  }
  return true;
}